

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void rapidxml::xml_document<char>::insert_coded_character<0>(char **text,unsigned_long code)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  
  if (code < 0x80) {
    lVar3 = 1;
  }
  else {
    uVar5 = (uint)code;
    bVar2 = (byte)code;
    if (code < 0x800) {
      (*text)[1] = bVar2 & 0x3f | 0x80;
      code = (unsigned_long)(byte)((byte)(uVar5 >> 6) | 0xc0);
      lVar3 = 2;
    }
    else if (code < 0x10000) {
      (*text)[2] = bVar2 & 0x3f | 0x80;
      (*text)[1] = (byte)(code >> 6) & 0x3f | 0x80;
      code = (unsigned_long)(byte)((byte)(uVar5 >> 0xc) | 0xe0);
      lVar3 = 3;
    }
    else {
      if (0x10ffff < code) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar1 = *text;
        *puVar4 = &PTR__exception_00b74cc8;
        puVar4[1] = "invalid numeric character entity";
        puVar4[2] = pcVar1;
        __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
      }
      (*text)[3] = bVar2 & 0x3f | 0x80;
      (*text)[2] = (byte)(code >> 6) & 0x3f | 0x80;
      (*text)[1] = (byte)(code >> 0xc) & 0x3f | 0x80;
      code = (unsigned_long)(byte)((byte)(uVar5 >> 0x12) | 0xf0);
      lVar3 = 4;
    }
  }
  **text = (char)code;
  *text = *text + lVar3;
  return;
}

Assistant:

static void insert_coded_character(Ch *&text, unsigned long code)
        {
            if (Flags & parse_no_utf8)
            {
                // Insert 8-bit ASCII character
                // Todo: possibly verify that code is less than 256 and use replacement char otherwise?
                text[0] = static_cast<unsigned char>(code);
                text += 1;
            }
            else
            {
                // Insert UTF8 sequence
                if (code < 0x80)    // 1 byte sequence
                {
	                text[0] = static_cast<unsigned char>(code);
                    text += 1;
                }
                else if (code < 0x800)  // 2 byte sequence
                {
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xC0);
                    text += 2;
                }
	            else if (code < 0x10000)    // 3 byte sequence
                {
	                text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xE0);
                    text += 3;
                }
	            else if (code < 0x110000)   // 4 byte sequence
                {
	                text[3] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xF0);
                    text += 4;
                }
                else    // Invalid, only codes up to 0x10FFFF are allowed in Unicode
                {
                    RAPIDXML_PARSE_ERROR("invalid numeric character entity", text);
                }
            }
        }